

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O2

int __thiscall cmCursesMainForm::Configure(cmCursesMainForm *this,int noconfigure)

{
  cmake *this_00;
  bool bVar1;
  char *pcVar2;
  cmCursesLongMessageForm *this_01;
  int iVar3;
  uint uVar4;
  string *path;
  uint uVar5;
  uint uVar6;
  allocator local_61;
  uint local_60;
  uint local_5c;
  string local_58;
  
  iVar3 = -1;
  uVar5 = 0xffffffff;
  local_5c = 0xffffffff;
  if (_stdscr != 0) {
    uVar5 = (int)*(short *)(_stdscr + 4) + 1;
    local_5c = (int)*(short *)(_stdscr + 6) + 1;
  }
  move(1,1);
  (*(this->super_cmCursesForm)._vptr_cmCursesForm[6])(this,"Configuring, please wait...");
  PrintKeys(this,1);
  if (_stdscr != 0) {
    iVar3 = *(short *)(_stdscr + 4) + 1;
  }
  wtouchln(_stdscr,0,iVar3,1);
  refresh();
  cmake::SetProgressCallback(this->CMakeInstance,UpdateProgress,this);
  FillCacheManagerFromUI(this);
  this_00 = this->CMakeInstance;
  pcVar2 = cmake::GetHomeOutputDirectory(this_00);
  std::__cxx11::string::string((string *)&local_58,pcVar2,&local_61);
  path = &local_58;
  local_60 = uVar5;
  cmake::SaveCache(this_00,path);
  std::__cxx11::string::~string((string *)&local_58);
  LoadCache(this,(char *)path);
  local_58._M_dataplus._M_p = (pointer)0x0;
  local_58._M_string_length = 0;
  local_58.field_2._M_allocated_capacity = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign(&this->Errors);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_58);
  this->OkToGenerate = true;
  if (noconfigure == 0) {
    uVar5 = cmake::Configure(this->CMakeInstance);
  }
  else {
    uVar5 = cmake::DoPreConfigureChecks(this->CMakeInstance);
    this->OkToGenerate = false;
    uVar5 = (int)uVar5 >> 0x1f & uVar5;
  }
  cmake::SetProgressCallback(this->CMakeInstance,(ProgressCallbackType)0x0,(void *)0x0);
  keypad(_stdscr,1);
  if ((uVar5 != 0) ||
     ((this->Errors).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->Errors).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    bVar1 = cmSystemTools::GetErrorOccuredFlag();
    if (bVar1) {
      this->OkToGenerate = false;
    }
    if (_stdscr == 0) {
      uVar6 = 0xffffffff;
      uVar4 = 0xffffffff;
    }
    else {
      uVar6 = (int)*(short *)(_stdscr + 4) + 1;
      uVar4 = (int)*(short *)(_stdscr + 6) + 1;
    }
    this_01 = (cmCursesLongMessageForm *)operator_new(0x60);
    bVar1 = cmSystemTools::GetErrorOccuredFlag();
    pcVar2 = "CMake produced the following output.";
    if (bVar1) {
      pcVar2 = "Errors occurred during the last pass.";
    }
    cmCursesLongMessageForm::cmCursesLongMessageForm(this_01,&this->Errors,pcVar2);
    cmSystemTools::s_FatalErrorOccured = false;
    cmSystemTools::s_ErrorOccured = false;
    cmCursesForm::CurrentForm = (cmCursesForm *)this_01;
    (*(this_01->super_cmCursesForm)._vptr_cmCursesForm[3])(this_01,1,1,(ulong)uVar4,(ulong)uVar6);
    (*(this_01->super_cmCursesForm)._vptr_cmCursesForm[2])(this_01);
    if (uVar5 == 0xfffffffe) {
      return -2;
    }
    cmCursesForm::CurrentForm = &this->super_cmCursesForm;
    (*(this->super_cmCursesForm)._vptr_cmCursesForm[3])(this,1,1,(ulong)uVar4,(ulong)uVar6);
  }
  InitializeUI(this);
  (*(this->super_cmCursesForm)._vptr_cmCursesForm[3])(this,1,1,(ulong)local_5c,(ulong)local_60);
  return 0;
}

Assistant:

int cmCursesMainForm::Configure(int noconfigure)
{
  int xi,yi;
  getmaxyx(stdscr, yi, xi);

  curses_move(1,1);
  this->UpdateStatusBar("Configuring, please wait...");
  this->PrintKeys(1);
  touchwin(stdscr);
  refresh();
  this->CMakeInstance->SetProgressCallback(cmCursesMainForm::UpdateProgress, this);

  // always save the current gui values to disk
  this->FillCacheManagerFromUI();
  this->CMakeInstance->SaveCache(
    this->CMakeInstance->GetHomeOutputDirectory());
  this->LoadCache(0);

  // Get rid of previous errors
  this->Errors = std::vector<std::string>();

  // run the generate process
  this->OkToGenerate = true;
  int retVal;
  if ( noconfigure )
    {
    retVal = this->CMakeInstance->DoPreConfigureChecks();
    this->OkToGenerate = false;
    if ( retVal > 0 )
      {
      retVal = 0;
      }
    }
  else
    {
    retVal = this->CMakeInstance->Configure();
    }
  this->CMakeInstance->SetProgressCallback(0, 0);

  keypad(stdscr,TRUE); /* Use key symbols as
                          KEY_DOWN*/

  if( retVal != 0 || !this->Errors.empty())
    {
    // see if there was an error
    if(cmSystemTools::GetErrorOccuredFlag())
      {
      this->OkToGenerate = false;
      }
    int xx,yy;
    getmaxyx(stdscr, yy, xx);
    cmCursesLongMessageForm* msgs = new cmCursesLongMessageForm(
      this->Errors,
      cmSystemTools::GetErrorOccuredFlag()
      ? "Errors occurred during the last pass." :
      "CMake produced the following output.");
    // reset error condition
    cmSystemTools::ResetErrorOccuredFlag();
    CurrentForm = msgs;
    msgs->Render(1,1,xx,yy);
    msgs->HandleInput();
    // If they typed the wrong source directory, we report
    // an error and exit
    if ( retVal == -2 )
      {
      return retVal;
      }
    CurrentForm = this;
    this->Render(1,1,xx,yy);
    }

  this->InitializeUI();
  this->Render(1, 1, xi, yi);

  return 0;
}